

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPathCommand::InitialPass
          (cmFindPathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  string *__lhs;
  CacheEntryType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  undefined1 local_48 [8];
  string result;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindPathCommand *this_local;
  
  result.field_2._8_8_ = param_2;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a file.");
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,"INCLUDE");
  uVar2 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xd])(this,argsIn);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if (((this->super_cmFindBase).AlreadyInCache & 1U) == 0) {
    FindHeader_abi_cxx11_((string *)local_48,this);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,pcVar3,pcVar5,
                 ((byte)(this->super_cmFindBase).field_0x242 & 1) + PATH,false);
    }
    else {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      __lhs = &(this->super_cmFindBase).VariableName;
      std::operator+(&local_78,__lhs,"-NOTFOUND");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,__lhs,pcVar3,pcVar5,((byte)(this->super_cmFindBase).field_0x242 & 1) + PATH,
                 false);
      std::__cxx11::string::~string((string *)&local_78);
    }
    this_local._7_1_ = true;
    local_58 = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    if (((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo & 1U) != 0) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      type = PATH;
      if (((this->super_cmFindBase).field_0x242 & 1) != 0) {
        type = FILEPATH;
      }
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,"",pcVar3,type,false);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFindPathCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a file.";
  this->CMakePathName = "INCLUDE";
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(
        this->VariableName, "",
        this->VariableDocumentation.c_str(),
        (this->IncludeFileInPath ?
         cmState::FILEPATH :cmState::PATH)
        );
      }
    return true;
    }

  std::string result = this->FindHeader();
  if(!result.empty())
    {
    this->Makefile->AddCacheDefinition
      (this->VariableName, result.c_str(),
       this->VariableDocumentation.c_str(),
       (this->IncludeFileInPath) ?
       cmState::FILEPATH :cmState::PATH);
    return true;
    }
  this->Makefile->AddCacheDefinition
    (this->VariableName,
     (this->VariableName + "-NOTFOUND").c_str(),
     this->VariableDocumentation.c_str(),
     (this->IncludeFileInPath) ?
     cmState::FILEPATH :cmState::PATH);
  return true;
}